

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall re2::RE2::CapturingGroupNames_abi_cxx11_(RE2 *this)

{
  anon_class_8_1_8991fb9c local_18;
  RE2 *local_10;
  RE2 *this_local;
  
  local_18.this = this;
  local_10 = this;
  std::call_once<re2::RE2::CapturingGroupNames[abi:cxx11]()const::__0>
            (&this->group_names_once_,&local_18);
  return this->group_names_;
}

Assistant:

const map<int, string>& RE2::CapturingGroupNames() const {
  std::call_once(group_names_once_, [this]() {
    if (suffix_regexp_ != NULL)
      group_names_ = suffix_regexp_->CaptureNames();
    if (group_names_ == NULL)
      group_names_ = empty_group_names;
  });
  return *group_names_;
}